

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

int __thiscall
cs_impl::any::clone(any *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  undefined4 extraout_var;
  proxy *ppVar2;
  proxy *extraout_RAX;
  error *this_00;
  int local_34;
  string local_30;
  
  ppVar2 = this->mDat;
  if (ppVar2 != (proxy *)0x0) {
    if (2 < ppVar2->protect_level) {
      this_00 = (error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_30,"E000L",(allocator *)&local_34);
      cov::error::error(this_00,&local_30);
      __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
    }
    local_34 = 1;
    iVar1 = (*ppVar2->data->_vptr_baseHolder[3])();
    local_30._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar1);
    ppVar2 = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
             alloc<int,cs_impl::any::baseHolder*>
                       ((allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>
                         *)allocator,&local_34,(baseHolder **)&local_30);
    recycle(this);
    this->mDat = ppVar2;
    ppVar2 = extraout_RAX;
  }
  return (int)ppVar2;
}

Assistant:

void clone()
		{
			if (mDat != nullptr) {
				if (mDat->protect_level > 2)
					throw cov::error("E000L");
				proxy *dat = allocator.alloc(1, mDat->data->duplicate());
				recycle();
				mDat = dat;
			}
		}